

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutBase.cpp
# Opt level: O1

void __thiscall cursespp::LayoutBase::RemoveFocusable(LayoutBase *this,IWindowPtr *window)

{
  shared_ptr<cursespp::IWindow> *psVar1;
  iterator __position;
  
  __position._M_current =
       (this->focusable).
       super__Vector_base<std::shared_ptr<cursespp::IWindow>,_std::allocator<std::shared_ptr<cursespp::IWindow>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->focusable).
           super__Vector_base<std::shared_ptr<cursespp::IWindow>,_std::allocator<std::shared_ptr<cursespp::IWindow>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current != psVar1) {
    do {
      if (((__position._M_current)->
          super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
          (window->super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) {
        std::
        vector<std::shared_ptr<cursespp::IWindow>,_std::allocator<std::shared_ptr<cursespp::IWindow>_>_>
        ::_M_erase(&this->focusable,__position);
        return;
      }
      __position._M_current = __position._M_current + 1;
    } while (__position._M_current != psVar1);
  }
  return;
}

Assistant:

void LayoutBase::RemoveFocusable(IWindowPtr window) {
    std::vector<IWindowPtr>::iterator it = this->focusable.begin();
    for (; it != this->focusable.end(); it++) {
        if (*it == window) {
            this->focusable.erase(it);
            return;
        }
    }
}